

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.c
# Opt level: O1

int pub0_pipe_init(void *arg,nni_pipe *pipe,void *s)

{
  size_t cap;
  
  nni_mtx_lock((nni_mtx *)((long)s + 0x18));
  cap = *(size_t *)((long)s + 0x48);
  nni_mtx_unlock((nni_mtx *)((long)s + 0x18));
  nni_lmq_init((nni_lmq *)((long)arg + 0x10),cap);
  nni_aio_init((nni_aio *)((long)arg + 0x60),pub0_pipe_send_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x228),pub0_pipe_recv_cb,arg);
  *(undefined1 *)((long)arg + 0x59) = 0;
  *(nni_pipe **)arg = pipe;
  *(void **)((long)arg + 8) = s;
  return 0;
}

Assistant:

static int
pub0_pipe_init(void *arg, nni_pipe *pipe, void *s)
{
	pub0_pipe *p    = arg;
	pub0_sock *sock = s;
	size_t     len;

	nni_mtx_lock(&sock->mtx);
	len = sock->sendbuf;
	nni_mtx_unlock(&sock->mtx);

	nni_lmq_init(&p->sendq, len);
	nni_aio_init(&p->aio_send, pub0_pipe_send_cb, p);
	nni_aio_init(&p->aio_recv, pub0_pipe_recv_cb, p);

	p->busy = false;
	p->pipe = pipe;
	p->pub  = s;
	return (0);
}